

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_internal.h
# Opt level: O1

void __thiscall FdbGcFunc::~FdbGcFunc(FdbGcFunc *this)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  
  if (this->done == false) {
    if ((this->func).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    (*(this->func)._M_invoker)((_Any_data *)&this->func);
    this->done = true;
  }
  p_Var1 = (this->func).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->func,(_Any_data *)&this->func,__destroy_functor);
  }
  return;
}

Assistant:

~FdbGcFunc() { gcNow(); }